

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

IGeneratorsForTest * __thiscall Catch::Context::getGeneratorsForCurrentTest(Context *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  IGeneratorsForTest *pIVar3;
  undefined4 extraout_var;
  string testName;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorsForTest_*>
  local_40;
  
  pIVar3 = findGeneratorsForCurrentTest(this);
  if (pIVar3 == (IGeneratorsForTest *)0x0) {
    iVar2 = (*(this->super_IMutableContext).super_IContext._vptr_IContext[2])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x40))
              (&local_60,(long *)CONCAT44(extraout_var,iVar2));
    pIVar3 = (IGeneratorsForTest *)operator_new(0x50);
    pIVar3->_vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3[1]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3[2]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3[3]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3->_vptr_IGeneratorsForTest = (_func_int **)&PTR__GeneratorsForTest_001b8550;
    pIVar3[4]._vptr_IGeneratorsForTest = (_func_int **)(pIVar3 + 2);
    pIVar3[5]._vptr_IGeneratorsForTest = (_func_int **)(pIVar3 + 2);
    pIVar3[6]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3[7]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3[8]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    pIVar3[9]._vptr_IGeneratorsForTest = (_func_int **)0x0;
    paVar1 = &local_40.first.field_2;
    local_40.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_40,local_60,local_60 + local_58);
    local_40.second = pIVar3;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::IGeneratorsForTest*>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::IGeneratorsForTest*>>>
                *)&this->m_generatorsByTestName,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.first._M_dataplus._M_p);
    }
    if (local_60 != local_50) {
      operator_delete(local_60);
    }
  }
  return pIVar3;
}

Assistant:

IGeneratorsForTest& getGeneratorsForCurrentTest() {
            IGeneratorsForTest* generators = findGeneratorsForCurrentTest();
            if( !generators ) {
                std::string testName = getResultCapture()->getCurrentTestName();
                generators = createGeneratorsForTest();
                m_generatorsByTestName.insert( std::make_pair( testName, generators ) );
            }
            return *generators;
        }